

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O0

QString * __thiscall
Win32MakefileGenerator::escapeDependencyPath(Win32MakefileGenerator *this,QString *path)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  QRegularExpression *in_RDI;
  long in_FS_OFFSET;
  QString *ret;
  char16_t *str;
  undefined4 in_stack_fffffffffffffef8;
  PatternOption in_stack_fffffffffffffefc;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff00;
  uint local_3c;
  QArrayDataPointer<char16_t> local_38;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)in_RDI = 0xaaaaaaaaaaaaaaaa;
  *(undefined8 *)(in_RDI + 8) = 0xaaaaaaaaaaaaaaaa;
  *(undefined8 *)(in_RDI + 0x10) = 0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)in_stack_ffffffffffffff00,
                   (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  bVar1 = QString::isEmpty((QString *)0x2bb671);
  if (!bVar1) {
    if ((escapeDependencyPath(QString_const&)::criticalChars == '\0') &&
       (iVar2 = __cxa_guard_acquire(&escapeDependencyPath(QString_const&)::criticalChars),
       iVar2 != 0)) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_38,(Data *)0x0,L"([\t #])",7);
      QString::QString((QString *)in_stack_ffffffffffffff00,
                       (DataPointer *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
      ;
      QFlags<QRegularExpression::PatternOption>::QFlags
                ((QFlags<QRegularExpression::PatternOption> *)in_stack_ffffffffffffff00,
                 in_stack_fffffffffffffefc);
      QRegularExpression::QRegularExpression
                ((QRegularExpression *)&escapeDependencyPath(QString_const&)::criticalChars,
                 (QString *)local_20,(QFlags_conflict *)(ulong)local_3c);
      QString::~QString((QString *)0x2bb725);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_ffffffffffffff00);
      __cxa_atexit(QRegularExpression::~QRegularExpression,
                   &escapeDependencyPath(QString_const&)::criticalChars,&__dso_handle);
      __cxa_guard_release(&escapeDependencyPath(QString_const&)::criticalChars);
    }
    uVar3 = QString::contains(in_RDI,(QRegularExpressionMatch *)
                                     &escapeDependencyPath(QString_const&)::criticalChars);
    if ((uVar3 & 1) != 0) {
      ::operator+((char (*) [2])in_stack_ffffffffffffff00,
                  (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      ::operator+((QStringBuilder<const_char_(&)[2],_QString_&> *)in_stack_ffffffffffffff00,
                  (char (*) [2])CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<const_char_(&)[2],_QString_&>,_const_char_(&)[2]> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QString::operator=((QString *)in_stack_ffffffffffffff00,
                         (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QString::~QString((QString *)0x2bb7e4);
    }
    if (Option::debug_level != 0) {
      QString::toLatin1((QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      pcVar4 = QByteArray::constData((QByteArray *)0x2bb809);
      QString::toLatin1((QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      pcVar5 = QByteArray::constData((QByteArray *)0x2bb827);
      debug_msg_internal(2,"EscapeDependencyPath: %s -> %s",pcVar4,pcVar5);
      QByteArray::~QByteArray((QByteArray *)0x2bb84c);
      QByteArray::~QByteArray((QByteArray *)0x2bb856);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString Win32MakefileGenerator::escapeDependencyPath(const QString &path) const
{
    QString ret = path;
    if (!ret.isEmpty()) {
        static const QRegularExpression criticalChars(QStringLiteral("([\t #])"));
        if (ret.contains(criticalChars))
            ret = "\"" + ret + "\"";
        debug_msg(2, "EscapeDependencyPath: %s -> %s", path.toLatin1().constData(), ret.toLatin1().constData());
    }
    return ret;
}